

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UBXProtocol.h
# Opt level: O2

void SetChecksumUBX(uchar *packet,int packetlen)

{
  long lVar1;
  uchar uVar2;
  long lVar3;
  uchar uVar4;
  
  lVar1 = (long)packetlen + -2;
  uVar2 = '\0';
  uVar4 = '\0';
  for (lVar3 = 2; lVar3 < lVar1; lVar3 = lVar3 + 1) {
    uVar2 = uVar2 + packet[lVar3];
    uVar4 = uVar4 + uVar2;
  }
  packet[lVar1] = uVar2;
  packet[(long)packetlen + -1] = uVar4;
  return;
}

Assistant:

inline void SetChecksumUBX(unsigned char* packet, int packetlen)
{
	int i = 0;
	unsigned char CK_A = 0, CK_B = 0;

	for (i = 2; i < packetlen-2; i++)
	{
		CK_A = (unsigned char)(CK_A + packet[i]);
		CK_B = (unsigned char)(CK_B + CK_A);
	}
	packet[packetlen-2] = CK_A;
	packet[packetlen-1] = CK_B;
}